

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O2

void capnp::compiler::parseFile
               (Reader statements,Builder result,ErrorReporter *errorReporter,bool requiresId)

{
  Reader statement;
  Builder builder_00;
  ListElementCount LVar1;
  bool bVar2;
  int iVar3;
  uint64_t i_00;
  SegmentBuilder *pSVar4;
  undefined7 in_register_00000031;
  char (*in_R8) [2];
  size_t i;
  ulong uVar5;
  long lVar6;
  Orphanage orphanageParam;
  undefined4 uStack_310;
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> decls;
  Builder annotationsBuilder;
  Builder fileDecl;
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> annotations;
  Builder declsBuilder;
  undefined8 uStack_250;
  IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
  local_248;
  OrphanBuilder local_238;
  StructDataBitCount local_218;
  StructPointerCount SStack_214;
  undefined2 uStack_212;
  Builder builder;
  OrphanBuilder local_1e8;
  CapnpParser parser;
  
  builder_00._builder.segment._4_4_ = (int)CONCAT71(in_register_00000031,requiresId);
  builder_00._builder.segment._0_4_ = uStack_310;
  builder_00._builder.capTable = (CapTableBuilder *)decls.builder.ptr;
  builder_00._builder.data = decls.builder.pos;
  builder_00._builder.pointers = (WirePointer *)decls.builder.endPtr;
  builder_00._builder._32_8_ = decls.builder.disposer;
  orphanageParam =
       Orphanage::getForMessageContaining<capnp::compiler::ParsedFile::Builder>(builder_00);
  CapnpParser::CapnpParser(&parser,orphanageParam,errorReporter);
  uVar5 = (ulong)statements.reader.elementCount;
  decls.builder.ptr =
       kj::_::HeapArrayDisposer::allocateUninitialized<capnp::Orphan<capnp::compiler::Declaration>>
                 (uVar5);
  decls.builder.endPtr = decls.builder.ptr + uVar5;
  decls.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  annotations.builder.endPtr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  annotations.builder.ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  annotations.builder.pos =
       (RemoveConst<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)0x0;
  annotations.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  decls.builder.pos = decls.builder.ptr;
  ParsedFile::Builder::getRoot(&fileDecl,&result);
  LVar1 = statements.reader.elementCount;
  local_248.container = &statements;
  *(undefined2 *)((long)fileDecl._builder.data + 2) = 0;
  for (local_248.index = 0; local_248.index != LVar1; local_248.index = local_248.index + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
    ::operator*((Reader *)&declsBuilder,&local_248);
    statement._reader.capTable = &(declsBuilder.builder.capTable)->super_CapTableReader;
    statement._reader.segment = &(declsBuilder.builder.segment)->super_SegmentReader;
    statement._reader.data = declsBuilder.builder.ptr;
    statement._reader.pointers = (WirePointer *)declsBuilder.builder._24_8_;
    statement._reader.dataSize = declsBuilder.builder.structDataSize;
    statement._reader.pointerCount = declsBuilder.builder.structPointerCount;
    statement._reader._38_1_ = declsBuilder.builder.elementSize;
    statement._reader._39_1_ = declsBuilder.builder._39_1_;
    statement._reader._40_8_ = uStack_250;
    CapnpParser::parseStatement
              ((Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *)&builder,&parser,statement,
               &parser.parsers.fileLevelDecl);
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::NullableValue
              ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)&annotationsBuilder,
               (NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)&builder);
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::~NullableValue
              ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)&builder);
    if ((char)annotationsBuilder.builder.segment == '\x01') {
      capnp::_::OrphanGetImpl<capnp::compiler::Declaration,_(capnp::Kind)3>::apply
                (&builder,(OrphanBuilder *)&annotationsBuilder.builder.capTable);
      if (*(short *)((long)builder._builder.data + 2) == 0xc) {
        if (*fileDecl._builder.data == 1) {
          in_R8 = (char (*) [2])0x1b;
          (**errorReporter->_vptr_ErrorReporter)
                    (errorReporter,(ulong)*(uint *)((long)builder._builder.data + 4),
                     (ulong)*(uint *)((long)builder._builder.data + 8),"File can only have one ID.")
          ;
        }
        else {
          local_218 = fileDecl._builder.dataSize;
          SStack_214 = fileDecl._builder.pointerCount;
          uStack_212 = fileDecl._builder._38_2_;
          local_238.capTable = (CapTableBuilder *)fileDecl._builder.data;
          local_238.location = (word *)fileDecl._builder.pointers;
          local_238.tag.content = (uint64_t)fileDecl._builder.segment;
          local_238.segment = (SegmentBuilder *)fileDecl._builder.capTable;
          Declaration::Builder::disownNakedId
                    ((Orphan<capnp::compiler::LocatedInteger> *)&local_1e8,&builder);
          Declaration::Id::Builder::adoptUid
                    ((Builder *)&local_238,(Orphan<capnp::compiler::LocatedInteger> *)&local_1e8);
          capnp::_::OrphanBuilder::~OrphanBuilder(&local_1e8);
          bVar2 = Declaration::Builder::hasDocComment(&builder);
          if (bVar2) {
            Declaration::Builder::disownDocComment((Orphan<capnp::Text> *)&local_238,&builder);
            Declaration::Builder::adoptDocComment(&fileDecl,(Orphan<capnp::Text> *)&local_238);
            capnp::_::OrphanBuilder::~OrphanBuilder(&local_238);
          }
        }
      }
      else if (*(short *)((long)builder._builder.data + 2) == 0xd) {
        Declaration::Builder::disownNakedAnnotation
                  ((Orphan<capnp::compiler::Declaration::AnnotationApplication> *)&local_238,
                   &builder);
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>::
        add<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>
                  ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>> *)
                   &annotations,
                   (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)&local_238);
        capnp::_::OrphanBuilder::~OrphanBuilder(&local_238);
      }
      else {
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration>>::
        add<capnp::Orphan<capnp::compiler::Declaration>>
                  ((Vector<capnp::Orphan<capnp::compiler::Declaration>> *)&decls,
                   (Orphan<capnp::compiler::Declaration> *)&annotationsBuilder.builder.capTable);
      }
    }
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::~NullableValue
              ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)&annotationsBuilder);
  }
  if (*fileDecl._builder.data != 1) {
    i_00 = generateRandomId();
    annotationsBuilder.builder.structDataSize = fileDecl._builder.dataSize;
    annotationsBuilder.builder.structPointerCount = fileDecl._builder.pointerCount;
    annotationsBuilder.builder.elementSize = fileDecl._builder._38_1_;
    annotationsBuilder.builder._39_1_ = fileDecl._builder._39_1_;
    annotationsBuilder.builder.ptr = (byte *)fileDecl._builder.data;
    annotationsBuilder.builder._24_8_ = fileDecl._builder.pointers;
    annotationsBuilder.builder.segment = fileDecl._builder.segment;
    annotationsBuilder.builder.capTable = fileDecl._builder.capTable;
    Declaration::Id::Builder::initUid((Builder *)&declsBuilder,(Builder *)&annotationsBuilder);
    *(uint64_t *)declsBuilder.builder.ptr = i_00;
    if ((requiresId) && (iVar3 = (*errorReporter->_vptr_ErrorReporter[1])(), (char)iVar3 == '\0')) {
      kj::hex((CappedArray<char,_17UL> *)&declsBuilder,i_00);
      kj::str<char_const(&)[91],kj::CappedArray<char,17ul>,char_const(&)[2]>
                ((String *)&annotationsBuilder,
                 (kj *)
                 "File does not declare an ID.  I\'ve generated one for you.  Add this line to your file: @0x"
                 ,(char (*) [91])&declsBuilder,(CappedArray<char,_17UL> *)";",in_R8);
      pSVar4 = annotationsBuilder.builder.segment;
      if (annotationsBuilder.builder.capTable == (CapTableBuilder *)0x0) {
        pSVar4 = (SegmentBuilder *)0x1bf653;
      }
      (**errorReporter->_vptr_ErrorReporter)
                (errorReporter,0,0,pSVar4,
                 (long)&((annotationsBuilder.builder.capTable)->super_CapTableReader).
                        _vptr_CapTableReader +
                 (ulong)(annotationsBuilder.builder.capTable == (CapTableBuilder *)0x0));
      kj::Array<char>::~Array((Array<char> *)&annotationsBuilder);
    }
  }
  Declaration::Builder::initNestedDecls
            (&declsBuilder,&fileDecl,
             (uint)((ulong)((long)decls.builder.pos - (long)decls.builder.ptr) >> 5));
  lVar6 = 0;
  for (uVar5 = 0; uVar5 < (ulong)((long)decls.builder.pos - (long)decls.builder.ptr >> 5);
      uVar5 = uVar5 + 1) {
    List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::adoptWithCaveats
              (&declsBuilder,(uint)uVar5,
               (Orphan<capnp::compiler::Declaration> *)
               ((long)&((decls.builder.ptr)->builder).tag.content + lVar6));
    lVar6 = lVar6 + 0x20;
  }
  Declaration::Builder::initAnnotations
            (&annotationsBuilder,&fileDecl,
             (uint)((ulong)((long)annotations.builder.pos - (long)annotations.builder.ptr) >> 5));
  lVar6 = 0;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)annotations.builder.pos - (long)annotations.builder.ptr >> 5);
      uVar5 = uVar5 + 1) {
    List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Builder::
    adoptWithCaveats(&annotationsBuilder,(uint)uVar5,
                     (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)
                     ((long)&((annotations.builder.ptr)->builder).tag.content + lVar6));
    lVar6 = lVar6 + 0x20;
  }
  kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::dispose
            (&annotations.builder);
  kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_>::dispose(&decls.builder);
  kj::Arena::~Arena(&parser.arena);
  return;
}

Assistant:

void parseFile(List<Statement>::Reader statements, ParsedFile::Builder result,
               ErrorReporter& errorReporter, bool requiresId) {
  CapnpParser parser(Orphanage::getForMessageContaining(result), errorReporter);

  kj::Vector<Orphan<Declaration>> decls(statements.size());
  kj::Vector<Orphan<Declaration::AnnotationApplication>> annotations;

  auto fileDecl = result.getRoot();
  fileDecl.setFile(VOID);

  for (auto statement: statements) {
    KJ_IF_SOME(decl, parser.parseStatement(statement, parser.getParsers().fileLevelDecl)) {
      Declaration::Builder builder = decl.get();
      switch (builder.which()) {
        case Declaration::NAKED_ID:
          if (fileDecl.getId().isUid()) {
            errorReporter.addError(builder.getStartByte(), builder.getEndByte(),
                                   "File can only have one ID.");
          } else {
            fileDecl.getId().adoptUid(builder.disownNakedId());
            if (builder.hasDocComment()) {
              fileDecl.adoptDocComment(builder.disownDocComment());
            }
          }
          break;
        case Declaration::NAKED_ANNOTATION:
          annotations.add(builder.disownNakedAnnotation());
          break;
        default:
          decls.add(kj::mv(decl));
          break;
      }
    }
  }

  if (fileDecl.getId().which() != Declaration::Id::UID) {
    // We didn't see an ID. Generate one randomly for now.
    uint64_t id = generateRandomId();
    fileDecl.getId().initUid().setValue(id);

    // Don't report missing ID if there was a parse error, because quite often the parse error
    // prevents us from parsing the ID even though it is actually there.
    if (requiresId && !errorReporter.hadErrors()) {
      errorReporter.addError(0, 0,
          kj::str("File does not declare an ID.  I've generated one for you.  Add this line to "
                  "your file: @0x", kj::hex(id), ";"));
    }
  }

  auto declsBuilder = fileDecl.initNestedDecls(decls.size());
  for (size_t i = 0; i < decls.size(); i++) {
    declsBuilder.adoptWithCaveats(i, kj::mv(decls[i]));
  }

  auto annotationsBuilder = fileDecl.initAnnotations(annotations.size());
  for (size_t i = 0; i < annotations.size(); i++) {
    annotationsBuilder.adoptWithCaveats(i, kj::mv(annotations[i]));
  }
}